

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# returnperiodtobin.cpp
# Opt level: O3

void doit(void)

{
  int iVar1;
  char *pcVar2;
  uint uVar3;
  int return_period;
  char line [4096];
  int local_103c;
  char local_1038 [4104];
  
  fgets(local_1038,0x1000,_stdin);
  pcVar2 = fgets(local_1038,0x1000,_stdin);
  if (pcVar2 != (char *)0x0) {
    uVar3 = 0;
    do {
      iVar1 = __isoc99_sscanf(local_1038,"%d",&local_103c);
      if (iVar1 != 1) {
        fprintf(_stderr,"FATAL: Invalid data in line %d:\n%s",(ulong)uVar3,local_1038);
        return;
      }
      if (return_periods.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          return_periods.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&return_periods,
                   (iterator)
                   return_periods.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_103c);
      }
      else {
        *return_periods.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish = local_103c;
        return_periods.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
        ._M_finish = return_periods.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
      }
      uVar3 = uVar3 + 1;
      pcVar2 = fgets(local_1038,0x1000,_stdin);
    } while (pcVar2 != (char *)0x0);
  }
  writereturnperiods();
  return;
}

Assistant:

void doit()
{
    int return_period;
    char line[4096];
    int lineno=0;
	fgets(line, sizeof(line), stdin);	// skip first line
    while (fgets(line, sizeof(line), stdin) != 0)
    {
       if (sscanf(line, "%d", &return_period) != 1){
           fprintf(stderr, "FATAL: Invalid data in line %d:\n%s", lineno, line);
           return;
       }
       else
       {           
		   return_periods.push_back(return_period);
       }
       lineno++;
    }
	writereturnperiods();
}